

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.h
# Opt level: O3

int __thiscall jrtplib::RTCPCompoundPacketBuilder::SDES::AddSSRC(SDES *this,uint32_t ssrc)

{
  size_t *psVar1;
  RTPMemoryManager *pRVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  
  pRVar2 = (this->super_RTPMemoryObject).mgr;
  if (pRVar2 == (RTPMemoryManager *)0x0) {
    p_Var3 = (_List_node_base *)operator_new(0x38);
  }
  else {
    p_Var3 = (_List_node_base *)(**(code **)(*(long *)pRVar2 + 0x10))(pRVar2,0x38,0x1f);
  }
  p_Var3->_M_prev = (_List_node_base *)(this->super_RTPMemoryObject).mgr;
  p_Var3->_M_next = (_List_node_base *)&PTR__SDESSource_0013c910;
  *(uint32_t *)&p_Var3[1]._M_next = ssrc;
  p_Var3[2]._M_next = (_List_node_base *)&p_Var3[1]._M_prev;
  p_Var3[1]._M_prev = (_List_node_base *)&p_Var3[1]._M_prev;
  p_Var3[2]._M_prev = (_List_node_base *)0x0;
  p_Var3[3]._M_next = (_List_node_base *)0x0;
  p_Var4 = (_List_node_base *)operator_new(0x18);
  p_Var4[1]._M_next = p_Var3;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  psVar1 = &(this->sdessources).
            super__List_base<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  (this->sdesit)._M_node =
       (this->sdessources).
       super__List_base<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>_>
       ._M_impl._M_node.super__List_node_base._M_prev;
  return 0;
}

Assistant:

int AddSSRC(uint32_t ssrc)
		{
			SDESSource *s = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_SDESSOURCE) SDESSource(ssrc,GetMemoryManager());
			if (s == 0)
				return ERR_RTP_OUTOFMEM;
			sdessources.push_back(s);
			sdesit = sdessources.end();
			sdesit--;
			return 0;
		}